

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

void Curl_hsts_cleanup(hsts **hp)

{
  hsts *list;
  Curl_llist_node *n;
  void *pvVar1;
  
  list = *hp;
  if (list != (hsts *)0x0) {
    n = Curl_llist_head(&list->list);
    while (n != (Curl_llist_node *)0x0) {
      pvVar1 = Curl_node_elem(n);
      n = Curl_node_next(n);
      (*Curl_cfree)(*(void **)((long)pvVar1 + 0x20));
      (*Curl_cfree)(pvVar1);
    }
    (*Curl_cfree)(list->filename);
    (*Curl_cfree)(list);
    *hp = (hsts *)0x0;
  }
  return;
}

Assistant:

void Curl_hsts_cleanup(struct hsts **hp)
{
  struct hsts *h = *hp;
  if(h) {
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      hsts_free(sts);
    }
    free(h->filename);
    free(h);
    *hp = NULL;
  }
}